

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
emplace_back<slang::syntax::ExpressionSyntax_const*>
          (SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *this,ExpressionSyntax **args)

{
  long lVar1;
  reference ppEVar2;
  pointer ppEVar3;
  
  lVar1 = *(long *)(this + 8);
  ppEVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppEVar3 = emplaceRealloc<slang::syntax::ExpressionSyntax_const*>(this,ppEVar3,args);
    return ppEVar3;
  }
  *ppEVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppEVar2 = SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::back
                      ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)this);
  return ppEVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }